

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseNumberProperty
               (double *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  char *member;
  ulong uVar2;
  json *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_d9;
  double dStack_d8;
  bool isDouble;
  double doubleValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  json_const_iterator it;
  string *parent_node_local;
  bool required_local;
  string *property_local;
  json *o_local;
  string *err_local;
  double *ret_local;
  
  it.m_it.primitive_iterator.m_it = (difference_type)parent_node;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_60);
  member = (char *)std::__cxx11::string::c_str();
  bVar1 = anon_unknown_57::FindMember(o,member,(json_const_iterator *)local_60);
  if (bVar1) {
    o_00 = anon_unknown_57::GetValue((json_const_iterator *)local_60);
    local_d9 = anon_unknown_57::GetDouble(o_00,&stack0xffffffffffffff28);
    if ((bool)local_d9) {
      if (ret != (double *)0x0) {
        *ret = dStack_d8;
      }
      ret_local._7_1_ = true;
    }
    else {
      if ((required) && (err != (string *)0x0)) {
        std::operator+(&local_120,"\'",property);
        std::operator+(&local_100,&local_120,"\' property is not a number type.\n");
        std::__cxx11::string::operator+=((string *)err,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
      }
      ret_local._7_1_ = false;
    }
  }
  else {
    if ((required) && (err != (string *)0x0)) {
      std::operator+(&local_a0,"\'",property);
      std::operator+(&local_80,&local_a0,"\' property is missing");
      std::__cxx11::string::operator+=((string *)err,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &doubleValue," in ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       it.m_it.primitive_iterator.m_it);
        std::__cxx11::string::operator+=((string *)err,(string *)&doubleValue);
        std::__cxx11::string::~string((string *)&doubleValue);
      }
      std::__cxx11::string::operator+=((string *)err,".\n");
    }
    ret_local._7_1_ = false;
  }
  return ret_local._7_1_;
}

Assistant:

static bool ParseNumberProperty(double *ret, std::string *err, const json &o,
                                const std::string &property,
                                const bool required,
                                const std::string &parent_node = "") {
  json_const_iterator it;

  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  double doubleValue;
  bool isDouble = GetDouble(GetValue(it), doubleValue);

  if (!isDouble) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a number type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = doubleValue;
  }

  return true;
}